

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalNinjaGenerator::AppendTargetOutputs
          (cmGlobalNinjaGenerator *this,cmGeneratorTarget *target,cmNinjaDeps *outputs,
          cmNinjaTargetDepends depends)

{
  cmMakefile *this_00;
  bool realname;
  TargetType TVar1;
  char *pcVar2;
  cmLocalGenerator *this_01;
  string *psVar3;
  string path;
  string configName;
  allocator local_a9;
  string local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  this_00 = target->Target->Makefile;
  std::__cxx11::string::string((string *)&local_a8,"CMAKE_BUILD_TYPE",(allocator *)&local_88);
  pcVar2 = cmMakefile::GetSafeDefinition(this_00,&local_a8);
  std::__cxx11::string::string((string *)&local_48,pcVar2,(allocator *)&local_68);
  std::__cxx11::string::~string((string *)&local_a8);
  realname = cmGeneratorTarget::IsFrameworkOnApple(target);
  TVar1 = cmGeneratorTarget::GetType(target);
  switch(TVar1) {
  case EXECUTABLE:
switchD_00362231_caseD_0:
    cmGeneratorTarget::GetFullPath(&local_88,target,&local_48,RuntimeBinaryArtifact,realname);
    ConvertToNinjaPath(&local_a8,this,&local_88);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)outputs,
               &local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    psVar3 = &local_88;
    break;
  case STATIC_LIBRARY:
  case SHARED_LIBRARY:
  case MODULE_LIBRARY:
    if (depends != DependOnTargetOrdering) goto switchD_00362231_caseD_0;
    OrderDependsTargetForTarget_abi_cxx11_(&local_a8,target);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)outputs,
               &local_a8);
    goto LAB_00362358;
  case OBJECT_LIBRARY:
    if (depends == DependOnTargetOrdering) {
      OrderDependsTargetForTarget_abi_cxx11_(&local_a8,target);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)outputs,
                 &local_a8);
      goto LAB_00362358;
    }
  case UTILITY:
  case GLOBAL_TARGET:
    this_01 = cmGeneratorTarget::GetLocalGenerator(target);
    pcVar2 = cmLocalGenerator::GetCurrentBinaryDirectory(this_01);
    std::__cxx11::string::string((string *)&local_68,"/",&local_a9);
    std::operator+(&local_88,pcVar2,&local_68);
    psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(target);
    std::operator+(&local_a8,&local_88,psVar3);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    ConvertToNinjaPath(&local_88,this,&local_a8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)outputs,
               &local_88);
    std::__cxx11::string::~string((string *)&local_88);
LAB_00362358:
    psVar3 = &local_a8;
    break;
  default:
    goto switchD_00362231_default;
  }
  std::__cxx11::string::~string((string *)psVar3);
switchD_00362231_default:
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::AppendTargetOutputs(
  cmGeneratorTarget const* target, cmNinjaDeps& outputs,
  cmNinjaTargetDepends depends)
{
  std::string configName =
    target->Target->GetMakefile()->GetSafeDefinition("CMAKE_BUILD_TYPE");

  // for frameworks, we want the real name, not smple name
  // frameworks always appear versioned, and the build.ninja
  // will always attempt to manage symbolic links instead
  // of letting cmOSXBundleGenerator do it.
  bool realname = target->IsFrameworkOnApple();

  switch (target->GetType()) {
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::STATIC_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY: {
      if (depends == DependOnTargetOrdering) {
        outputs.push_back(OrderDependsTargetForTarget(target));
        break;
      }
    }
    // FALLTHROUGH
    case cmStateEnums::EXECUTABLE: {
      outputs.push_back(this->ConvertToNinjaPath(target->GetFullPath(
        configName, cmStateEnums::RuntimeBinaryArtifact, realname)));
      break;
    }
    case cmStateEnums::OBJECT_LIBRARY: {
      if (depends == DependOnTargetOrdering) {
        outputs.push_back(OrderDependsTargetForTarget(target));
        break;
      }
    }
    // FALLTHROUGH
    case cmStateEnums::GLOBAL_TARGET:
    case cmStateEnums::UTILITY: {
      std::string path =
        target->GetLocalGenerator()->GetCurrentBinaryDirectory() +
        std::string("/") + target->GetName();
      outputs.push_back(this->ConvertToNinjaPath(path));
      break;
    }

    default:
      return;
  }
}